

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O2

bool xemmai::t_signature<unsigned_long,unsigned_long>::f_match<0ul,1ul>(undefined8 *a_stack)

{
  bool bVar1;
  
  bVar1 = t_type_of<long>::t_cast<unsigned_long>::f_is((t_object *)*a_stack);
  if (bVar1) {
    bVar1 = t_type_of<long>::t_cast<unsigned_long>::f_is((t_object *)a_stack[2]);
    return bVar1;
  }
  return false;
}

Assistant:

static bool f_match(t_pvalue* a_stack, std::index_sequence<A_i...>)
	{
		return (f_is<T_an>(a_stack[A_i]) && ...);
	}